

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

int __thiscall doctest::Context::run(Context *this)

{
  int *piVar1;
  pointer *pppIVar2;
  char *pcVar3;
  pointer pvVar4;
  iterator __position;
  const_iterator __position_00;
  pointer ppIVar5;
  ContextState *pCVar6;
  vector<doctest::String,_std::allocator<doctest::String>_> *filters;
  iterator __last;
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  ContextState *pCVar12;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Var13;
  size_t sVar14;
  const_iterator cVar15;
  long lVar16;
  int result;
  uint uVar17;
  code *__comp;
  _Ios_Openmode _Var18;
  TestCase *pTVar19;
  ContextState *pCVar20;
  undefined1 *puVar21;
  IReporter **curr;
  pointer ppIVar22;
  byte bVar23;
  IReporter **curr_rep;
  ulong uVar24;
  long in_FS_OFFSET;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  timeval t;
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  char local_389;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  local_378;
  iterator iStack_370;
  TestCase **local_368;
  undefined1 local_358 [32];
  undefined1 local_338 [136];
  int local_2b0;
  TestCase **local_2a0;
  TestCase *local_298;
  TestCase **local_290;
  sigaltstack local_288;
  undefined1 local_270 [16];
  anon_union_24_2_13149d16_for_String_2 local_260;
  TestCase *local_248;
  char local_240 [16];
  ostream local_230 [512];
  
  pCVar12 = detail::g_cs;
  detail::g_cs = this->p;
  is_running_in_test = 1;
  pCVar20 = this->p;
  *(bool *)(in_FS_OFFSET + -0x38) = (pCVar20->super_ContextOptions).no_colors;
  (pCVar20->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar20->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  *(undefined8 *)&(pCVar20->super_ContextOptions).field_0x8c = 0;
  *(undefined8 *)&pCVar20->field_0x94 = 0;
  *(undefined8 *)&pCVar20->field_0x9c = 0;
  pCVar20 = this->p;
  (pCVar20->super_ContextOptions).cout = (ostream *)&std::cout;
  (pCVar20->super_ContextOptions).cerr = (ostream *)&std::cerr;
  std::fstream::fstream(local_240);
  pCVar20 = this->p;
  bVar23 = (pCVar20->super_ContextOptions).out.field_0.buf[0x17];
  if ((char)bVar23 < '\0') {
    uVar17 = (pCVar20->super_ContextOptions).out.field_0.data.size;
  }
  else {
    uVar17 = 0x17 - (bVar23 & 0x1f);
  }
  if (uVar17 != 0) {
    if ((char)bVar23 < '\0') {
      _Var18 = (_Ios_Openmode)*(undefined8 *)&(pCVar20->super_ContextOptions).out.field_0;
    }
    else {
      _Var18 = (int)pCVar20 + (_S_trunc|_S_out);
    }
    std::fstream::open(local_240,_Var18);
    (this->p->super_ContextOptions).cout = local_230;
  }
  pCVar20 = (anonymous_namespace)::FatalConditionHandler::altStackSize;
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       operator_new__((ulong)(anonymous_namespace)::FatalConditionHandler::altStackSize);
  pvVar4 = (this->p->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar4[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar4[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    String::String((String *)local_338,"console",7);
    pCVar20 = (ContextState *)(pvVar4 + 8);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              ((vector<doctest::String,_std::allocator<doctest::String>_> *)pCVar20,
               (String *)local_338);
    if (((long)local_338._16_8_ < 0) &&
       (pCVar20 = (ContextState *)local_338._0_8_,
       (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
      operator_delete__((void *)local_338._0_8_);
    }
  }
  local_358._24_8_ = pCVar12;
  anon_unknown_14::getReporters();
  if ((_Rb_tree_header *)
      anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar12 = (ContextState *)
              anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      pCVar20 = pCVar12;
      if ((pCVar20->super_ContextOptions).out.field_0.buf[0xf] < '\0') {
        pTVar19 = (pCVar20->super_ContextOptions).currentTest;
      }
      else {
        pTVar19 = (TestCase *)&(pCVar20->super_ContextOptions).currentTest;
      }
      pCVar12 = this->p;
      bVar8 = anon_unknown_14::matchesAny
                        ((char *)pTVar19,
                         (pCVar12->filters).
                         super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8,false,
                         (pCVar12->super_ContextOptions).case_sensitive);
      if (bVar8) {
        local_338._0_8_ =
             (**(code **)((long)&(pCVar20->super_ContextOptions).out.field_0 + 0x10))(detail::g_cs);
        __position._M_current =
             (pCVar12->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pCVar12->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
          _M_realloc_insert<doctest::IReporter*>
                    ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                     &pCVar12->reporters_currently_used,__position,(IReporter **)local_338);
        }
        else {
          *__position._M_current = (IReporter *)local_338._0_8_;
          pppIVar2 = &(pCVar12->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar2 = *pppIVar2 + 1;
        }
      }
      pCVar12 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar20);
    } while (pCVar12 !=
             (ContextState *)&anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  anon_unknown_14::getListeners();
  if ((_Rb_tree_header *)
      anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar12 = (ContextState *)
              anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      pCVar20 = pCVar12;
      pCVar12 = this->p;
      __position_00._M_current =
           (pCVar12->reporters_currently_used).
           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_338._0_8_ =
           (**(code **)((long)&(pCVar20->super_ContextOptions).out.field_0 + 0x10))(detail::g_cs);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
                (&pCVar12->reporters_currently_used,__position_00,(value_type *)local_338);
      pCVar12 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar20);
    } while (pCVar12 !=
             (ContextState *)&anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  pCVar12 = this->p;
  if (((((pCVar12->super_ContextOptions).no_run != false) ||
       ((pCVar12->super_ContextOptions).version != false)) ||
      ((pCVar12->super_ContextOptions).help != false)) ||
     ((pCVar12->super_ContextOptions).list_reporters == true)) {
    ppIVar22 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar5 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar22 != ppIVar5) {
      do {
        local_338._0_8_ = (ContextState *)0x0;
        local_338._8_8_ = (void *)0x0;
        local_338._16_8_ = 0;
        (**(*ppIVar22)->_vptr_IReporter)(*ppIVar22,local_338);
        ppIVar22 = ppIVar22 + 1;
      } while (ppIVar22 != ppIVar5);
    }
    if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
      operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
    }
    cVar9 = std::__basic_file<char>::is_open();
    uVar7 = local_358._24_8_;
    if (cVar9 != '\0') {
      std::fstream::close();
    }
    detail::g_cs = (ContextState *)uVar7;
    is_running_in_test = 0;
    ppIVar5 = (this->p->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar22 = (this->p->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar22 != ppIVar5;
        ppIVar22 = ppIVar22 + 1) {
      if (*ppIVar22 != (IReporter *)0x0) {
        (*(*ppIVar22)->_vptr_IReporter[0xd])();
      }
    }
    pCVar20 = this->p;
    ppIVar22 = (pCVar20->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pCVar20->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar22) {
      (pCVar20->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar22;
    }
    if ((*(int *)&pCVar20->field_0x98 == 0) ||
       (iVar11 = 1, (pCVar20->super_ContextOptions).no_exitcode == true)) {
      iVar11 = 0;
    }
    goto LAB_0010aeca;
  }
  local_378._M_current = (TestCase **)0x0;
  iStack_370._M_current = (TestCase **)0x0;
  local_368 = (TestCase **)0x0;
  detail::getRegisteredTests();
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar12 = (ContextState *)
              detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pCVar20 = pCVar12;
      local_338._0_8_ = (long)&(pCVar20->super_ContextOptions).binary_name.field_0 + 0x10;
      if (iStack_370._M_current == local_368) {
        std::
        vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>::
        _M_realloc_insert<doctest::detail::TestCase_const*>
                  ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                    *)&local_378,iStack_370,(TestCase **)local_338);
      }
      else {
        *iStack_370._M_current = (TestCase *)local_338._0_8_;
        iStack_370._M_current = iStack_370._M_current + 1;
      }
      pCVar12 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar20);
    } while (pCVar12 !=
             (ContextState *)&detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
  }
  __last._M_current = iStack_370._M_current;
  _Var13._M_current = local_378._M_current;
  pCVar12 = this->p;
  *(int *)&(pCVar12->super_ContextOptions).field_0x8c =
       (int)((ulong)((long)iStack_370._M_current - (long)local_378._M_current) >> 3);
  if (iStack_370._M_current != local_378._M_current) {
    pCVar20 = (ContextState *)&(pCVar12->super_ContextOptions).order_by;
    iVar11 = String::compare((String *)pCVar20,"file",true);
    if (iVar11 == 0) {
      __comp = anon_unknown_14::fileOrderComparator;
    }
    else {
      iVar11 = String::compare((String *)pCVar20,"suite",true);
      if (iVar11 == 0) {
        __comp = anon_unknown_14::suiteOrderComparator;
      }
      else {
        iVar11 = String::compare((String *)pCVar20,"name",true);
        if (iVar11 != 0) {
          iVar11 = String::compare((String *)pCVar20,"rand",true);
          if (iVar11 == 0) {
            uVar17 = (pCVar12->super_ContextOptions).rand_seed;
            pCVar20 = (ContextState *)(ulong)uVar17;
            srand(uVar17);
            _Var13._M_current = local_378._M_current;
            for (uVar24 = (long)iStack_370._M_current - (long)local_378._M_current >> 3; uVar24 != 1
                ; uVar24 = uVar24 - 1) {
              iVar11 = rand();
              pTVar19 = _Var13._M_current[uVar24 - 1];
              iVar11 = (int)((ulong)(long)iVar11 % uVar24);
              _Var13._M_current[uVar24 - 1] = _Var13._M_current[iVar11];
              _Var13._M_current[iVar11] = pTVar19;
            }
          }
          goto LAB_0010b052;
        }
        __comp = anon_unknown_14::nameOrderComparator;
      }
    }
    std::
    sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
              (_Var13,(__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                       )__last._M_current,__comp);
    pCVar20 = (ContextState *)_Var13._M_current;
  }
LAB_0010b052:
  local_260._8_8_ = local_270 + 8;
  local_270._8_4_ = _S_red;
  local_260.data.ptr = (char *)0x0;
  local_248 = (TestCase *)0x0;
  pCVar12 = this->p;
  local_389 = '\x01';
  if (((pCVar12->super_ContextOptions).count == false) &&
     ((pCVar12->super_ContextOptions).list_test_cases == false)) {
    local_389 = (pCVar12->super_ContextOptions).list_test_suites;
  }
  local_358._0_8_ = (ostream *)0x0;
  local_358._8_8_ = (ostream *)0x0;
  local_358._16_8_ = (TestCaseData **)0x0;
  local_260._16_8_ = local_260._8_8_;
  if (local_389 == '\0') {
    ppIVar5 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar22 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar22 != ppIVar5;
        ppIVar22 = ppIVar22 + 1) {
      pCVar20 = (ContextState *)*ppIVar22;
      (**(code **)((pCVar20->super_ContextOptions).cout + 8))();
    }
  }
  local_2a0 = iStack_370._M_current;
  _Var13._M_current = local_378._M_current;
  if (local_378._M_current != iStack_370._M_current) {
    do {
      pCVar12 = (ContextState *)*_Var13._M_current;
      if ((pCVar12->super_ContextOptions).out.field_0.buf[8] == '\x01') {
        bVar23 = (this->p->super_ContextOptions).no_skip ^ 1;
      }
      else {
        bVar23 = 0;
      }
      pCVar20 = pCVar12;
      if ((pCVar12->super_ContextOptions).binary_name.field_0.buf[7] < '\0') {
        pCVar20 = (ContextState *)(pCVar12->super_ContextOptions).cout;
      }
      pCVar6 = this->p;
      filters = (pCVar6->filters).
                super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar8 = (pCVar6->super_ContextOptions).case_sensitive;
      local_290 = _Var13._M_current;
      bVar10 = anon_unknown_14::matchesAny((char *)pCVar20,filters,true,bVar8);
      if (!bVar10) {
        bVar23 = 1;
      }
      bVar10 = anon_unknown_14::matchesAny((char *)pCVar20,filters + 1,false,bVar8);
      if (bVar10) {
        bVar23 = 1;
      }
      pTVar19 = (pCVar12->super_ContextOptions).currentTest;
      bVar10 = anon_unknown_14::matchesAny((char *)pTVar19,filters + 2,true,bVar8);
      if (!bVar10) {
        bVar23 = 1;
      }
      local_298 = pTVar19;
      bVar10 = anon_unknown_14::matchesAny((char *)pTVar19,filters + 3,false,bVar8);
      if (bVar10) {
        bVar23 = 1;
      }
      pCVar20 = *(ContextState **)
                 ((long)&(pCVar12->super_ContextOptions).binary_name.field_0 + 0x10);
      bVar10 = anon_unknown_14::matchesAny((char *)pCVar20,filters + 4,true,bVar8);
      if (!bVar10) {
        bVar23 = 1;
      }
      bVar8 = anon_unknown_14::matchesAny((char *)pCVar20,filters + 5,false,bVar8);
      pTVar19 = local_298;
      if (bVar8) {
        bVar23 = 1;
      }
      if ((bVar23 & 1) == 0) {
        *(int *)&pCVar6->field_0x90 = *(int *)&pCVar6->field_0x90 + 1;
      }
      uVar17 = (pCVar6->super_ContextOptions).last;
      if (((uVar17 < *(uint *)&pCVar6->field_0x90) &&
          ((pCVar6->super_ContextOptions).first <= uVar17)) ||
         (*(uint *)&pCVar6->field_0x90 < (pCVar6->super_ContextOptions).first)) {
        bVar23 = 1;
      }
      bVar8 = false;
      if ((bVar23 & 1) == 0) {
        if ((pCVar6->super_ContextOptions).count == false) {
          if ((pCVar6->super_ContextOptions).list_test_cases == true) {
            if (local_358._8_8_ == local_358._16_8_) {
              pCVar20 = (ContextState *)local_358;
              local_338._0_8_ = pCVar12;
              std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
              ::_M_realloc_insert<doctest::TestCaseData_const*>
                        ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                          *)pCVar20,(iterator)local_358._8_8_,(TestCaseData **)local_338);
            }
            else {
              *(ContextState **)local_358._8_8_ = pCVar12;
              local_358._8_8_ = local_358._8_8_ + 8;
              local_338._0_8_ = pCVar12;
            }
          }
          else if ((pCVar6->super_ContextOptions).list_test_suites == true) {
            sVar14 = strlen((char *)local_298);
            String::String((String *)local_338,(char *)pTVar19,(uint)sVar14);
            pCVar20 = (ContextState *)local_270;
            cVar15 = std::
                     _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                     ::find((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                             *)pCVar20,(String *)local_338);
            if (cVar15._M_node == (_Base_ptr)(local_270 + 8)) {
              cVar9 = (((pCVar12->super_ContextOptions).currentTest)->super_TestCaseData).m_file.
                      field_0.buf[0];
              if (((long)local_338._16_8_ < 0) &&
                 (pCVar20 = (ContextState *)local_338._0_8_,
                 (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
                operator_delete__((void *)local_338._0_8_);
              }
              if (cVar9 != '\0') {
                local_338._0_8_ = pCVar12;
                std::
                vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                ::push_back((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                             *)local_358,(value_type *)local_338);
                pTVar19 = (pCVar12->super_ContextOptions).currentTest;
                sVar14 = strlen((char *)pTVar19);
                String::String((String *)local_338,(char *)pTVar19,(uint)sVar14);
                pCVar20 = (ContextState *)local_270;
                std::
                _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                ::_M_insert_unique<doctest::String>
                          ((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                            *)pCVar20,(String *)local_338);
                if (((long)local_338._16_8_ < 0) &&
                   (pCVar20 = (ContextState *)local_338._0_8_,
                   (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
                  operator_delete__((void *)local_338._0_8_);
                }
                puVar21 = &this->p->field_0x94;
                *(int *)puVar21 = *(int *)puVar21 + 1;
              }
            }
            else if (((long)local_338._16_8_ < 0) &&
                    (pCVar20 = (ContextState *)local_338._0_8_,
                    (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
              operator_delete__((void *)local_338._0_8_);
            }
          }
          else {
            (pCVar6->super_ContextOptions).currentTest = (TestCase *)pCVar12;
            (pCVar6->super_CurrentTestCaseStats).failure_flags = 0;
            (pCVar6->super_CurrentTestCaseStats).seconds = 0.0;
            lVar16 = 0;
            do {
              LOCK();
              pcVar3 = (pCVar6->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                       lVar16 + -4;
              pcVar3[0] = '\0';
              pcVar3[1] = '\0';
              pcVar3[2] = '\0';
              pcVar3[3] = '\0';
              UNLOCK();
              lVar16 = lVar16 + 0x40;
            } while (lVar16 != 0x800);
            pCVar20 = this->p;
            lVar16 = 0;
            do {
              LOCK();
              pcVar3 = (pCVar20->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar16 + -4;
              pcVar3[0] = '\0';
              pcVar3[1] = '\0';
              pcVar3[2] = '\0';
              pcVar3[3] = '\0';
              UNLOCK();
              lVar16 = lVar16 + 0x40;
            } while (lVar16 != 0x800);
            std::
            _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
            ::clear(&(this->p->subcasesPassed)._M_t);
            ppIVar5 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar22 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar22 != ppIVar5;
                ppIVar22 = ppIVar22 + 1) {
              (*(*ppIVar22)->_vptr_IReporter[3])();
            }
            pCVar20 = this->p;
            gettimeofday((timeval *)local_338,(__timezone_ptr_t)0x0);
            (pCVar20->timer).m_ticks = (ticks_t)(local_338._0_8_ * 1000000 + local_338._8_8_);
            bVar8 = true;
            do {
              pCVar20 = this->p;
              pCVar20->should_reenter = false;
              pCVar20->subcasesCurrentMaxLevel = 0;
              std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              _M_erase_at_end(&pCVar20->subcasesStack,
                              (pCVar20->subcasesStack).
                              super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              LOCK();
              (this->p->shouldLogCurrentException)._M_base._M_i = true;
              UNLOCK();
              std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
                        (&this->p->stringifiedContexts,
                         (this->p->stringifiedContexts).
                         super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              (anonymous_namespace)::FatalConditionHandler::isSet = 1;
              local_288.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
              local_288.ss_size = (size_t)(anonymous_namespace)::FatalConditionHandler::altStackSize
              ;
              local_288.ss_flags = 0;
              sigaltstack(&local_288,
                          (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
              memset((sigaction *)local_338,0,0x98);
              local_338._0_8_ = anon_unknown_14::FatalConditionHandler::handleSignal;
              local_2b0 = 0x8000000;
              puVar21 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
              lVar16 = 0;
              do {
                sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar16),
                          (sigaction *)local_338,(sigaction *)puVar21);
                lVar16 = lVar16 + 0x10;
                puVar21 = (undefined1 *)((long)puVar21 + 0x98);
              } while (lVar16 != 0x60);
              (**(code **)((long)&(pCVar12->super_ContextOptions).order_by.field_0 + 8))();
              anon_unknown_14::FatalConditionHandler::reset();
              anon_unknown_14::FatalConditionHandler::reset();
              pCVar20 = this->p;
              if (0 < (pCVar20->super_ContextOptions).abort_after) {
                iVar11 = 0;
                lVar16 = 0;
                do {
                  iVar11 = iVar11 + *(int *)((pCVar20->numAssertsFailedCurrentTest_atomic).m_atomics
                                             [0].padding + lVar16 + -4);
                  lVar16 = lVar16 + 0x40;
                } while (lVar16 != 0x800);
                if ((this->p->super_ContextOptions).abort_after <=
                    iVar11 + *(int *)&pCVar20->field_0xa0) {
                  piVar1 = &(this->p->super_CurrentTestCaseStats).failure_flags;
                  *(byte *)piVar1 = (byte)*piVar1 | 8;
                  bVar8 = false;
                }
              }
              if ((this->p->should_reenter == true) && (bVar8)) {
                ppIVar5 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (ppIVar22 = (detail::g_cs->reporters_currently_used).
                                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start; ppIVar22 != ppIVar5;
                    ppIVar22 = ppIVar22 + 1) {
                  (*(*ppIVar22)->_vptr_IReporter[4])(*ppIVar22,pCVar12);
                }
              }
              pCVar20 = this->p;
              if (pCVar20->should_reenter == false) {
                bVar8 = false;
              }
            } while (bVar8);
            detail::ContextState::finalizeTestCaseData(pCVar20);
            ppIVar5 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar22 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar22 != ppIVar5;
                ppIVar22 = ppIVar22 + 1) {
              pCVar20 = (ContextState *)*ppIVar22;
              (**(code **)((pCVar20->super_ContextOptions).cout + 0x28))
                        (pCVar20,&detail::g_cs->super_CurrentTestCaseStats);
            }
            pCVar12 = this->p;
            (pCVar12->super_ContextOptions).currentTest = (TestCase *)0x0;
            iVar11 = (pCVar12->super_ContextOptions).abort_after;
            if ((iVar11 < 1) || (bVar8 = true, *(int *)&pCVar12->field_0xa0 < iVar11)) {
              bVar8 = false;
            }
          }
        }
      }
      else if (local_389 == '\0') {
        ppIVar5 = (detail::g_cs->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar22 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppIVar22 != ppIVar5;
            ppIVar22 = ppIVar22 + 1) {
          pCVar20 = (ContextState *)*ppIVar22;
          (**(code **)((pCVar20->super_ContextOptions).cout + 0x58))(pCVar20,pCVar12);
        }
      }
    } while ((!bVar8) && (_Var13._M_current = local_290 + 1, local_290 + 1 != local_2a0));
  }
  if (local_389 == '\0') {
    ppIVar5 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar22 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar22 != ppIVar5;
        ppIVar22 = ppIVar22 + 1) {
      pCVar20 = (ContextState *)*ppIVar22;
      (**(code **)((pCVar20->super_ContextOptions).cout + 0x10))
                (pCVar20,&(detail::g_cs->super_ContextOptions).field_0x8c);
    }
  }
  else {
    local_338._0_8_ = &(detail::g_cs->super_ContextOptions).field_0x8c;
    if (detail::g_cs == (ContextState *)0x0) {
      local_338._0_8_ = (ContextState *)0x0;
    }
    local_338._8_8_ = local_358._0_8_;
    local_338._16_4_ = (int)((ulong)(local_358._8_8_ - local_358._0_8_) >> 3);
    ppIVar22 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar5 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar22 != ppIVar5) {
      do {
        pCVar20 = (ContextState *)*ppIVar22;
        (**(code **)(pCVar20->super_ContextOptions).cout)(pCVar20,local_338);
        ppIVar22 = ppIVar22 + 1;
      } while (ppIVar22 != ppIVar5);
    }
  }
  run::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)pCVar20);
  uVar7 = local_358._24_8_;
  if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
    operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
  }
  cVar9 = std::__basic_file<char>::is_open();
  if (cVar9 != '\0') {
    std::fstream::close();
  }
  detail::g_cs = (ContextState *)uVar7;
  is_running_in_test = 0;
  ppIVar5 = (this->p->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar22 = (this->p->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppIVar22 != ppIVar5;
      ppIVar22 = ppIVar22 + 1) {
    if (*ppIVar22 != (IReporter *)0x0) {
      (*(*ppIVar22)->_vptr_IReporter[0xd])();
    }
  }
  pCVar20 = this->p;
  ppIVar22 = (pCVar20->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if ((pCVar20->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar22) {
    (pCVar20->reporters_currently_used).
    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar22;
  }
  if ((*(int *)&pCVar20->field_0x98 == 0) ||
     (iVar11 = 1, (pCVar20->super_ContextOptions).no_exitcode == true)) {
    iVar11 = 0;
  }
  if ((ostream *)local_358._0_8_ != (ostream *)0x0) {
    operator_delete((void *)local_358._0_8_);
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
               *)local_270);
  if (local_378._M_current != (TestCase **)0x0) {
    operator_delete(local_378._M_current);
  }
LAB_0010aeca:
  std::fstream::~fstream(local_240);
  return iVar11;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    // stdout by default
    p->cout = &std::cout;
    p->cerr = &std::cerr;

    // or to a file if specified
    std::fstream fstr;
    if(p->out.size()) {
        fstr.open(p->out.c_str(), std::fstream::out);
        p->cout = &fstr;
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    // see these issues on the reasoning for this:
    // - https://github.com/onqtam/doctest/issues/143#issuecomment-414418903
    // - https://github.com/onqtam/doctest/issues/126
    auto DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS = []() DOCTEST_NOINLINE
        { std::cout << std::string(); };
    DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS();

    return cleanup_and_return();
}